

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NKmerIndex.cc
# Opt level: O2

void __thiscall
NKmerIndex::NKmerIndex
          (NKmerIndex *this,SequenceDistanceGraph *_sg,uint8_t k,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *whitelist)

{
  vector<kmerPos,_std::allocator<kmerPos>_> *this_00;
  pointer pNVar1;
  pointer pkVar2;
  pointer ppVar3;
  size_type sVar4;
  runtime_error *this_01;
  size_type *psVar5;
  ulong uVar6;
  pair<bool,_unsigned_long> *kmer;
  pointer ppVar7;
  long lVar8;
  uint uVar9;
  uint64_t kidx;
  ulong __n;
  vector<kmerPos,_std::allocator<kmerPos>_> local_kmers;
  uint local_28c;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  contig_kmers;
  ulong local_270;
  ulong local_268;
  StringKMerFactory skf;
  
  BloomFilter::BloomFilter(&this->bfilter,0x4600000,1);
  this_00 = &this->assembly_kmers;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->k = k;
  this->sg = _sg;
  if (0x1f < k) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"You are trying to use K>31, which is not supported by NKmerIndex");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar1 = (_sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar5 = &pNVar1[1].sequence._M_string_length;
  __n = 0;
  for (uVar6 = 1;
      uVar6 < (ulong)(((long)(_sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pNVar1) / 0x38);
      uVar6 = uVar6 + 1) {
    __n = __n + *psVar5;
    psVar5 = psVar5 + 7;
  }
  std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve(this_00,__n);
  local_268 = (ulong)k;
  StringKMerFactory::StringKMerFactory(&skf,k);
  local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve(&local_kmers,__n >> 2);
  contig_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contig_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contig_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve(&contig_kmers,10000000);
  for (local_270 = 1;
      pNVar1 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start,
      local_270 <
      (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar1) / 0x38);
      local_270 = local_270 + 1) {
    if (local_268 <= pNVar1[local_270].sequence._M_string_length) {
      if (contig_kmers.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          contig_kmers.
          super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        contig_kmers.
        super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             contig_kmers.
             super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      StringKMerFactory::create_kmers(&skf,&pNVar1[local_270].sequence,&contig_kmers);
      ppVar3 = contig_kmers.
               super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = 0;
      for (ppVar7 = contig_kmers.
                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1
          ) {
        sVar4 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&whitelist->_M_h,&ppVar7->second);
        if (sVar4 != 0) {
          local_28c = ~uVar9;
          if (ppVar7->first != false) {
            local_28c = uVar9 + 1;
          }
          std::vector<kmerPos,std::allocator<kmerPos>>::emplace_back<unsigned_long_const&,long&,int>
                    ((vector<kmerPos,std::allocator<kmerPos>> *)&local_kmers,&ppVar7->second,
                     (long *)&local_270,(int *)&local_28c);
        }
        uVar9 = uVar9 + 1;
      }
    }
    if ((12800000000 <
         (ulong)((long)local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                      super__Vector_impl_data._M_start)) &&
       (std::vector<kmerPos,std::allocator<kmerPos>>::
        insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,void>
                  ((vector<kmerPos,std::allocator<kmerPos>> *)this_00,
                   (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>)
                   local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>)
                   local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                   super__Vector_impl_data._M_finish),
       local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  if ((local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (std::vector<kmerPos,std::allocator<kmerPos>>::
      insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,void>
                ((vector<kmerPos,std::allocator<kmerPos>> *)this_00,
                 (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>)
                 local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>)
                 local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                 super__Vector_impl_data._M_finish),
     local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
     super__Vector_impl_data._M_finish !=
     local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::
  _Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  ~_Vector_base(&contig_kmers.
                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               );
  std::_Vector_base<kmerPos,_std::allocator<kmerPos>_>::~_Vector_base
            (&local_kmers.super__Vector_base<kmerPos,_std::allocator<kmerPos>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,__gnu_cxx::__ops::_Iter_comp_iter<kmerPos::byKmerContigOffset>>
            ((this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
             super__Vector_impl_data._M_finish);
  lVar8 = 0;
  for (uVar6 = 0;
      pkVar2 = (this->assembly_kmers).super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->assembly_kmers).
                            super__Vector_base<kmerPos,_std::allocator<kmerPos>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pkVar2 >> 4);
      uVar6 = uVar6 + 1) {
    BloomFilter::add(&this->bfilter,(uint64_t *)((long)&pkVar2->kmer + lVar8));
    lVar8 = lVar8 + 0x10;
  }
  return;
}

Assistant:

NKmerIndex::NKmerIndex(const SequenceDistanceGraph &_sg, uint8_t k, std::unordered_set<uint64_t> whitelist):
        k(k), bfilter(70*1024*1024), sg(_sg){
    if (k > 31) {
        throw std::runtime_error("You are trying to use K>31, which is not supported by NKmerIndex");
    }
    uint64_t total_length=0;
#pragma omp parallel for reduction(+:total_length)
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        total_length+=sg.nodes[n].sequence.size();
    }
    assembly_kmers.reserve(total_length);
#pragma omp parallel
    {
        StringKMerFactory skf(k);
        std::vector<kmerPos> local_kmers;
        local_kmers.reserve(total_length/(omp_get_num_threads()*4));
        std::vector<std::pair<bool,uint64_t > > contig_kmers;
        contig_kmers.reserve(10000000);
#pragma omp for
        for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
            if (sg.nodes[n].sequence.size() >= k) {
                contig_kmers.clear();
                skf.create_kmers(sg.nodes[n].sequence, contig_kmers);
                int k_i(0);
                for (const auto &kmer:contig_kmers) {
                    if (whitelist.count(kmer.second)) local_kmers.emplace_back(kmer.second, n, kmer.first ? k_i + 1 : -(k_i + 1));

                    k_i++;
                }
            }

            if (local_kmers.size() > 800000000) {
#pragma omp critical(push_kmers)
                {
                    assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
                }
                local_kmers.clear();
            }
        }
        if (!local_kmers.empty()) {
#pragma omp critical(push_kmers)
            {
                assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
            }
            local_kmers.clear();
        }
    }
    sdglib::sort(assembly_kmers.begin(),assembly_kmers.end(), kmerPos::byKmerContigOffset());

#pragma omp parallel for
    for (uint64_t kidx = 0; kidx < assembly_kmers.size(); ++kidx) {
        bfilter.add(assembly_kmers[kidx].kmer);
    }
}